

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void TestFreeList(void)

{
  undefined8 ****ppppuVar1;
  undefined8 ****ppppuVar2;
  bool bVar3;
  undefined8 ***pppuVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  ulong uVar7;
  _List_node_base *unaff_RBP;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  ulong unaff_R14;
  uint uVar10;
  long lVar11;
  list<People_*,_std::allocator<People_*>_> check_list;
  undefined8 ***local_48;
  undefined8 ***local_40;
  long local_38;
  
  puts("===================== TestFreeList BEGIN =====================");
  local_48 = &local_48;
  local_38 = 0;
  lVar11 = 10;
  bVar3 = false;
  p_Var6 = (_List_node_base *)0x0;
  local_40 = local_48;
  do {
    if (!bVar3) {
      unaff_R14 = 0;
      bVar3 = true;
      unaff_RBP = (_List_node_base *)0x0;
    }
    p_Var5 = unaff_RBP;
    uVar7 = unaff_R14;
    if (unaff_R14 < 8) {
      p_Var5 = (_List_node_base *)mmap((void *)0x0,0x8000000,3,0x22,-1,0);
      p_Var8 = (_List_node_base *)0x0;
      uVar7 = 0x8000000;
      if (p_Var5 != (_List_node_base *)0xffffffffffffffff) goto LAB_00104915;
    }
    else {
LAB_00104915:
      unaff_RBP = (_List_node_base *)&p_Var5->_M_prev;
      unaff_R14 = uVar7 - 8;
      p_Var8 = p_Var5;
    }
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = p_Var8;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    local_38 = local_38 + 1;
    p_Var8->_M_next = p_Var6;
    lVar11 = lVar11 + -1;
    p_Var6 = p_Var8;
    if (lVar11 == 0) {
      lVar11 = 10;
      uVar10 = 0xb;
      p_Var6 = (_List_node_base *)0x0;
      do {
        pppuVar4 = local_48;
        uVar10 = uVar10 - 1;
        if (uVar10 != (uint)lVar11) {
          __assert_fail("freelist.FreeObjects() == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                        ,0x45,"void TestFreeList()");
        }
        if (lVar11 == 0) {
          p_Var9 = (_List_node_base *)0x0;
          p_Var5 = p_Var8;
        }
        else {
          lVar11 = lVar11 + -1;
          p_Var5 = p_Var8->_M_next;
          p_Var9 = p_Var8;
        }
        p_Var8 = (_List_node_base *)local_48[2];
        if (p_Var9 != p_Var8) {
          __assert_fail("(People*)freelist.PopFront() == check_list.front()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                        ,0x46,"void TestFreeList()");
        }
        if (!bVar3) {
          __assert_fail("inited",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                        ,0x22,"void tcmalloc::FixedAllocator<People>::Free(T *) [T = People]");
        }
        p_Var8->_M_next = p_Var6;
        local_38 = local_38 + -1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pppuVar4,0x18);
        p_Var6 = p_Var8;
        p_Var8 = p_Var5;
      } while (1 < uVar10);
      if (lVar11 != 0) {
        __assert_fail("freelist.Empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                      ,0x4a,"void TestFreeList()");
      }
      puts("===================== TestFreeList Finish =====================");
      ppppuVar2 = (undefined8 ****)local_48;
      while (ppppuVar2 != &local_48) {
        ppppuVar1 = (undefined8 ****)*ppppuVar2;
        operator_delete(ppppuVar2,0x18);
        ppppuVar2 = ppppuVar1;
      }
      return;
    }
  } while( true );
}

Assistant:

void TestFreeList() {
    printf("===================== TestFreeList BEGIN =====================\n");
    struct People {
        People(int age) : age_(age) {}
        int     age_;
        int     padding;
    };
    tcmalloc::FixedAllocator<People> allocator;

    std::list<People*> check_list;
    tcmalloc::FreeList freelist;
    assert(freelist.Empty());
    for (int i = 0; i < 10; ++i) {
        People* ptr = allocator.Alloc();
        check_list.push_front(ptr);
        freelist.PushFront(ptr);
        assert(freelist.FreeObjects() == (i+1));
    }
    for (int i = 10; i > 0; --i) {
        assert(freelist.FreeObjects() == i);
        assert((People*)freelist.PopFront() == check_list.front());
        allocator.Free(check_list.front());
        check_list.pop_front();
    }
    assert(freelist.Empty());
    printf("===================== TestFreeList Finish =====================\n");
}